

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O2

_Bool increment_overflow_time(time_t *tp,int_fast32_t j)

{
  ulong uVar1;
  long lVar2;
  
  if (j < 0) {
    uVar1 = (ulong)j;
    lVar2 = *tp;
    if (lVar2 < (long)(-0x8000000000000000 - uVar1)) {
      return true;
    }
  }
  else {
    lVar2 = *tp;
    uVar1 = (ulong)(uint)j;
    if ((long)(uVar1 ^ 0x7fffffffffffffff) < lVar2) {
      return true;
    }
  }
  *tp = uVar1 + lVar2;
  return false;
}

Assistant:

static bool increment_overflow_time( time_t * tp, int_fast32_t j )
{
    /* This is like
       'if (! (_PDCLIB_TIME_MIN <= *tp + j && *tp + j <= _PDCLIB_TIME_MAX)) ...',
       except that it does the right thing even if *tp + j would overflow.
    */
    if ( ! ( j < 0
           ? ( _PDCLIB_TYPE_SIGNED( time_t ) ? _PDCLIB_TIME_MIN - j <= *tp : -1 - j < *tp )
           : *tp <= _PDCLIB_TIME_MAX - j ) )
    {
        return true;
    }

    *tp += j;
    return false;
}